

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O3

void __thiscall xray_re::se_monster::state_read(se_monster *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((se_monster *)
             &this[-1].super_cse_alife_monster_base.super_cse_alife_monster_abstract.
              super_cse_alife_creature_abstract.field_0x98,in_RSI,in_DX);
  return;
}

Assistant:

void se_monster::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_monster_base::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		packet.r_sz(m_off_level_vertex_id);
		packet.r_sz(m_active_section);
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.r_u8(m_job_online);
		if (m_job_online > 2)
			packet.skip_sz();
		if (m_script_version >= 7)
			packet.r_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.r_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
			if (m_job_online > 2)
				packet.skip_sz();
		}
		if (m_script_version >= 5)
			packet.r_bool(m_was_in_smart_terrain);
	} else if (m_version == CSE_VERSION_2571) {
		if (m_script_version >= 4)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2232) {
		if (m_script_version >= 3)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.r_bool(m_was_in_smart_terrain);
	} else if (m_version >= CSE_VERSION_0x27 && m_version <= CSE_VERSION_0x2e) {
		// no script entity
	} else {
		xr_not_implemented();
	}
}